

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderNavHighlight(ImRect *bb,ImGuiID id,ImGuiNavHighlightFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *pIVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImGuiContext *pIVar11;
  ImU32 IVar12;
  ImGuiContext *g;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ImRect display_rect;
  ImVec2 local_78;
  ImVec2 aIStack_70 [2];
  float local_5c;
  ImVec4 local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar11 = GImGui;
  if ((GImGui->NavId == id) && (((flags & 4U) != 0 || (GImGui->NavDisableHighlight == false)))) {
    pIVar5 = GImGui->CurrentWindow;
    pIVar5->WriteAccessed = true;
    if ((pIVar5->DC).NavHideHighlightOneFrame == false) {
      local_5c = 0.0;
      if ((flags & 8U) == 0) {
        local_5c = (pIVar11->Style).FrameRounding;
      }
      fVar1 = (pIVar5->ClipRect).Min.x;
      fVar2 = (pIVar5->ClipRect).Min.y;
      local_78.x = (bb->Min).x;
      local_78.y = (bb->Min).y;
      fVar14 = (float)(~-(uint)(fVar1 <= local_78.x) & (uint)fVar1 |
                      (uint)local_78.x & -(uint)(fVar1 <= local_78.x));
      fVar13 = (float)(~-(uint)(fVar2 <= local_78.y) & (uint)fVar2 |
                      (uint)local_78.y & -(uint)(fVar2 <= local_78.y));
      local_78.y = fVar13;
      local_78.x = fVar14;
      aIStack_70[0].x = (bb->Max).x;
      fVar3 = (pIVar5->ClipRect).Max.x;
      fVar4 = (pIVar5->ClipRect).Max.y;
      if (fVar3 <= aIStack_70[0].x) {
        aIStack_70[0].x = fVar3;
      }
      aIStack_70[0].y = (bb->Max).y;
      if (fVar4 <= aIStack_70[0].y) {
        aIStack_70[0].y = fVar4;
      }
      if ((flags & 1U) != 0) {
        fVar14 = fVar14 + -4.0;
        fVar13 = fVar13 + -4.0;
        local_78.y = fVar13;
        local_78.x = fVar14;
        fVar16 = aIStack_70[0].x + 4.0;
        fVar15 = aIStack_70[0].y + 4.0;
        aIStack_70[0].y = fVar15;
        aIStack_70[0].x = fVar16;
        if ((fVar4 < fVar15 || fVar3 < fVar16) || (fVar13 < fVar2 || fVar14 < fVar1)) {
          ImDrawList::PushClipRect(pIVar5->DrawList,local_78,aIStack_70[0],false);
        }
        local_38.x = local_78.x + 1.0;
        pIVar6 = pIVar5->DrawList;
        local_38.y = local_78.y + 1.0;
        local_40.x = aIStack_70[0].x + -1.0;
        local_40.y = aIStack_70[0].y + -1.0;
        local_58.x = (GImGui->Style).Colors[0x28].x;
        local_58.y = (GImGui->Style).Colors[0x28].y;
        uVar7 = (GImGui->Style).Colors[0x28].z;
        uVar8 = (GImGui->Style).Colors[0x28].w;
        local_58.w = (GImGui->Style).Alpha * (float)uVar8;
        local_58.z = (float)uVar7;
        IVar12 = ColorConvertFloat4ToU32(&local_58);
        ImDrawList::AddRect(pIVar6,&local_38,&local_40,IVar12,local_5c,0xf,2.0);
        if ((fVar4 < fVar15 || fVar3 < fVar16) || (fVar13 < fVar2 || fVar14 < fVar1)) {
          ImDrawList::PopClipRect(pIVar5->DrawList);
        }
      }
      if ((flags & 2U) != 0) {
        pIVar6 = pIVar5->DrawList;
        local_58.x = (GImGui->Style).Colors[0x28].x;
        local_58.y = (GImGui->Style).Colors[0x28].y;
        uVar9 = (GImGui->Style).Colors[0x28].z;
        uVar10 = (GImGui->Style).Colors[0x28].w;
        local_58.w = (GImGui->Style).Alpha * (float)uVar10;
        local_58.z = (float)uVar9;
        IVar12 = ColorConvertFloat4ToU32(&local_58);
        ImDrawList::AddRect(pIVar6,&local_78,aIStack_70,IVar12,local_5c,-1,1.0);
      }
    }
  }
  return;
}

Assistant:

void ImGui::RenderNavHighlight(const ImRect& bb, ImGuiID id, ImGuiNavHighlightFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (id != g.NavId)
        return;
    if (g.NavDisableHighlight && !(flags & ImGuiNavHighlightFlags_AlwaysDraw))
        return;
    ImGuiWindow* window = ImGui::GetCurrentWindow();
    if (window->DC.NavHideHighlightOneFrame)
        return;

    float rounding = (flags & ImGuiNavHighlightFlags_NoRounding) ? 0.0f : g.Style.FrameRounding;
    ImRect display_rect = bb;
    display_rect.ClipWith(window->ClipRect);
    if (flags & ImGuiNavHighlightFlags_TypeDefault)
    {
        const float THICKNESS = 2.0f;
        const float DISTANCE = 3.0f + THICKNESS * 0.5f;
        display_rect.Expand(ImVec2(DISTANCE,DISTANCE));
        bool fully_visible = window->ClipRect.Contains(display_rect);
        if (!fully_visible)
            window->DrawList->PushClipRect(display_rect.Min, display_rect.Max);
        window->DrawList->AddRect(display_rect.Min + ImVec2(THICKNESS*0.5f,THICKNESS*0.5f), display_rect.Max - ImVec2(THICKNESS*0.5f,THICKNESS*0.5f), GetColorU32(ImGuiCol_NavHighlight), rounding, ImDrawCornerFlags_All, THICKNESS);
        if (!fully_visible)
            window->DrawList->PopClipRect();
    }
    if (flags & ImGuiNavHighlightFlags_TypeThin)
    {
        window->DrawList->AddRect(display_rect.Min, display_rect.Max, GetColorU32(ImGuiCol_NavHighlight), rounding, ~0, 1.0f);
    }
}